

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O2

int __thiscall QListViewPrivate::flipX(QListViewPrivate *this,int x)

{
  int iVar1;
  QWidgetData *pQVar2;
  int iVar3;
  
  pQVar2 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  iVar3 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
  iVar1 = (this->commonListView->contentsSize).wd.m_i;
  if (iVar3 <= iVar1) {
    iVar3 = iVar1;
  }
  return iVar3 - x;
}

Assistant:

inline int flipX(int x) const
        { return qMax(viewport->width(), contentsSize().width()) - x; }